

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxequilisc.hpp
# Opt level: O0

void __thiscall
soplex::
SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::scale(SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *lp,bool persistent)

{
  Verbosity VVar1;
  element_type *this_00;
  SPxOut *t;
  SPxOut *_spxout;
  byte in_DL;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RSI;
  long *in_RDI;
  Verbosity old_verbosity_3;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  bool colFirst;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rowratio;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  colratio;
  Verbosity old_verbosity;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffff4c8;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffff4d0;
  double in_stack_fffffffffffff4d8;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffff4e0;
  undefined1 local_a60 [128];
  undefined1 local_9e0 [128];
  undefined1 local_960 [128];
  undefined1 local_8e0 [128];
  undefined4 local_860;
  Verbosity local_85c;
  undefined1 local_858 [128];
  undefined1 local_7d8 [128];
  undefined1 local_758 [128];
  undefined1 local_6d8 [112];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff998;
  DataArray<int> *in_stack_fffffffffffff9a0;
  undefined4 in_stack_fffffffffffff9a8;
  undefined4 in_stack_fffffffffffff9ac;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff9b0;
  undefined1 local_5d0 [128];
  undefined1 local_550 [128];
  undefined1 local_4d0 [128];
  undefined1 local_450 [128];
  undefined1 local_3d0 [128];
  undefined1 local_350 [128];
  undefined1 local_2d0 [128];
  undefined4 local_250;
  Verbosity local_24c;
  byte local_245;
  Real local_228;
  undefined1 local_21c [128];
  undefined1 local_19c [128];
  undefined1 local_11c [128];
  undefined4 local_9c;
  Verbosity local_98;
  byte local_91;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_90;
  undefined8 local_80;
  Real *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  Real *local_8;
  
  local_91 = in_DL & 1;
  local_90 = in_RSI;
  if ((in_RDI[5] != 0) && (VVar1 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]), 2 < (int)VVar1)) {
    local_98 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]);
    local_9c = 3;
    (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_9c);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff4d0,(char *)in_stack_fffffffffffff4c8);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff4d0,(char *)in_stack_fffffffffffff4c8);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff4d0,
                       (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff4c8);
    (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_98);
  }
  (**(code **)*in_RDI)(in_RDI,local_90);
  (**(code **)(*in_RDI + 0x198))(local_11c,in_RDI,local_90);
  (**(code **)(*in_RDI + 0x1a0))(local_19c,in_RDI,local_90);
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::tolerances((SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_fffffffffffff4c8);
  this_00 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x74c40d);
  local_228 = Tolerances::epsilon(this_00);
  local_70 = local_21c;
  local_78 = &local_228;
  local_80 = 0;
  local_8 = local_78;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d0);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x74c49c);
  local_245 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffff4c8,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x74c4b1);
  if ((in_RDI[5] != 0) && (VVar1 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]), 3 < (int)VVar1)) {
    local_24c = SPxOut::getVerbosity((SPxOut *)in_RDI[5]);
    local_250 = 4;
    (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_250);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff4d0,(char *)in_stack_fffffffffffff4c8);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff4d0,(char *)in_stack_fffffffffffff4c8);
    (*(local_90->
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[3])(local_2d0,local_90,1);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff4d0,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff4c8);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff4d0,(char *)in_stack_fffffffffffff4c8);
    (*(local_90->
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[4])(local_350,local_90,1);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff4d0,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff4c8);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff4d0,(char *)in_stack_fffffffffffff4c8);
    local_60 = local_3d0;
    local_68 = local_11c;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff4d0,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff4c8);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff4d0,(char *)in_stack_fffffffffffff4c8);
    local_50 = local_450;
    local_58 = local_19c;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff4d0,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff4c8);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff4d0,
                       (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff4c8);
    (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_24c);
  }
  if ((local_245 & 1) == 0) {
    LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::rowSet(local_90);
    local_20 = local_5d0;
    local_28 = local_21c;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8);
    computeEquiExpVec(in_stack_fffffffffffff9b0,
                      (DataArray<int> *)
                      CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                      in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
    if ((*(byte *)((long)in_RDI + 0x21) & 1) != 0) {
      LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::colSet((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)(local_90 + 1));
      local_10 = &stack0xfffffffffffff9b0;
      local_18 = local_21c;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8);
      computeEquiExpVec(in_stack_fffffffffffff9b0,
                        (DataArray<int> *)
                        CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                        in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
    }
  }
  else {
    LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::colSet((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)(local_90 + 1));
    local_40 = local_4d0;
    local_48 = local_21c;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8);
    computeEquiExpVec(in_stack_fffffffffffff9b0,
                      (DataArray<int> *)
                      CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                      in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
    if ((*(byte *)((long)in_RDI + 0x21) & 1) != 0) {
      LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::rowSet(local_90);
      local_30 = local_550;
      local_38 = local_21c;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8);
      computeEquiExpVec(in_stack_fffffffffffff9b0,
                        (DataArray<int> *)
                        CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                        in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
    }
  }
  (**(code **)(*in_RDI + 0x10))(in_RDI,local_90);
  if ((in_RDI[5] != 0) && (VVar1 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]), 4 < (int)VVar1)) {
    SPxOut::getVerbosity((SPxOut *)in_RDI[5]);
    (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&stack0xfffffffffffff9a8);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff4d0,(char *)in_stack_fffffffffffff4c8);
    (**(code **)(*in_RDI + 0x188))(local_6d8);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff4d0,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff4c8);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff4d0,(char *)in_stack_fffffffffffff4c8);
    (**(code **)(*in_RDI + 400))(local_758);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff4d0,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff4c8);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff4d0,
                       (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff4c8);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff4d0,(char *)in_stack_fffffffffffff4c8);
    (**(code **)(*in_RDI + 0x178))(local_7d8);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff4d0,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff4c8);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff4d0,(char *)in_stack_fffffffffffff4c8);
    (**(code **)(*in_RDI + 0x180))(local_858);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff4d0,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff4c8);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff4d0,
                       (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff4c8);
    (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&stack0xfffffffffffff9ac);
  }
  if ((in_RDI[5] != 0) && (VVar1 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]), 3 < (int)VVar1)) {
    local_85c = SPxOut::getVerbosity((SPxOut *)in_RDI[5]);
    local_860 = 4;
    (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_860);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff4d0,(char *)in_stack_fffffffffffff4c8);
    t = soplex::operator<<((SPxOut *)in_stack_fffffffffffff4d0,(char *)in_stack_fffffffffffff4c8);
    (*(local_90->
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[3])(local_8e0,local_90,0);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff4d0,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)t);
    _spxout = soplex::operator<<((SPxOut *)in_stack_fffffffffffff4d0,(char *)t);
    (*(local_90->
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[4])(local_960,local_90,0);
    soplex::operator<<(_spxout,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)t);
    soplex::operator<<(_spxout,(char *)t);
    (**(code **)(*in_RDI + 0x198))(local_9e0,in_RDI,local_90);
    soplex::operator<<(_spxout,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)t);
    soplex::operator<<(_spxout,(char *)t);
    (**(code **)(*in_RDI + 0x1a0))(local_a60,in_RDI,local_90);
    soplex::operator<<(_spxout,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)t);
    soplex::operator<<(_spxout,(_func_ostream_ptr_ostream_ptr *)t);
    (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_85c);
  }
  return;
}

Assistant:

void SPxEquiliSC<R>::scale(SPxLPBase<R>& lp, bool persistent)
{

   SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Equilibrium scaling LP" <<
                 (persistent ? " (persistent)" : "") << std::endl;)

   this->setup(lp);

   /* We want to do the direction first, which has a lower maximal ratio,
    * since the lowest value in the scaled matrix is bounded from below by
    * the inverse of the maximum ratio of the direction that is done first
    * Example:
    *
    *                     Rowratio
    *            0.1  1   10
    *            10   1   10
    *
    * Colratio   100  1
    *
    * Row first =>         Col next =>
    *            0.1  1          0.1  1
    *            1    0.1        1    0.1
    *
    * Col first =>         Row next =>
    *            0.01 1          0.01 1
    *            1    1          1    1
    *
    */
   R colratio = this->maxColRatio(lp);
   R rowratio = this->maxRowRatio(lp);
   R epsilon = this->tolerances()->epsilon();

   bool colFirst = colratio < rowratio;

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "before scaling:"
                 << " min= " << lp.minAbsNzo()
                 << " max= " << lp.maxAbsNzo()
                 << " col-ratio= " << colratio
                 << " row-ratio= " << rowratio
                 << std::endl;)

   if(colFirst)
   {
      computeEquiExpVec(lp.colSet(), *this->m_activeRowscaleExp, *this->m_activeColscaleExp, epsilon);

      if(this->m_doBoth)
         computeEquiExpVec(lp.rowSet(), *this->m_activeColscaleExp, *this->m_activeRowscaleExp, epsilon);
   }
   else
   {
      computeEquiExpVec(lp.rowSet(), *this->m_activeColscaleExp, *this->m_activeRowscaleExp, epsilon);

      if(this->m_doBoth)
         computeEquiExpVec(lp.colSet(), *this->m_activeRowscaleExp, *this->m_activeColscaleExp, epsilon);
   }

   /* scale */
   this->applyScaling(lp);

   SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Row scaling min= " << this->minAbsRowscale()
                 << " max= " << this->maxAbsRowscale()
                 << std::endl
                 << "Col scaling min= " << this->minAbsColscale()
                 << " max= " << this->maxAbsColscale()
                 << std::endl;)

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "after scaling: "
                 << " min= " << lp.minAbsNzo(false)
                 << " max= " << lp.maxAbsNzo(false)
                 << " col-ratio= " << this->maxColRatio(lp)
                 << " row-ratio= " << this->maxRowRatio(lp)
                 << std::endl;)

}